

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManFromIfLogicCreateLut
              (Gia_Man_t *pNew,word *pRes,Vec_Int_t *vLeaves,Vec_Int_t *vCover,Vec_Int_t *vMapping,
              Vec_Int_t *vMapping2)

{
  int Lit;
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  Lit = Kit_TruthToGia(pNew,(uint *)pRes,vLeaves->nSize,vCover,vLeaves,0);
  iVar1 = Abc_Lit2Var(Lit);
  if (iVar1 != 0) {
    do {
      if (vLeaves->nSize <= iVar3) {
        iVar1 = Abc_Lit2Var(Lit);
        Vec_IntSetEntry(vMapping,iVar1,vMapping2->nSize);
        Vec_IntPush(vMapping2,vLeaves->nSize);
        for (iVar1 = 0; iVar1 < vLeaves->nSize; iVar1 = iVar1 + 1) {
          iVar3 = Vec_IntEntry(vLeaves,iVar1);
          iVar3 = Abc_Lit2Var(iVar3);
          Vec_IntPush(vMapping2,iVar3);
        }
        iVar1 = Abc_Lit2Var(Lit);
        Vec_IntPush(vMapping2,iVar1);
        return Lit;
      }
      iVar1 = Vec_IntEntry(vLeaves,iVar3);
      iVar2 = Abc_Lit2Var(Lit);
      iVar1 = Abc_Lit2Var(iVar1);
      iVar3 = iVar3 + 1;
    } while (iVar2 != iVar1);
  }
  return Lit;
}

Assistant:

int Gia_ManFromIfLogicCreateLut( Gia_Man_t * pNew, word * pRes, Vec_Int_t * vLeaves, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2 )
{
    int i, iLit, iObjLit1;
    iObjLit1 = Kit_TruthToGia( pNew, (unsigned *)pRes, Vec_IntSize(vLeaves), vCover, vLeaves, 0 );
    // do not create LUT in the simple case
    if ( Abc_Lit2Var(iObjLit1) == 0 )
        return iObjLit1;
    Vec_IntForEachEntry( vLeaves, iLit, i )
        if ( Abc_Lit2Var(iObjLit1) == Abc_Lit2Var(iLit) )
            return iObjLit1;
    // write mapping
    Vec_IntSetEntry( vMapping, Abc_Lit2Var(iObjLit1), Vec_IntSize(vMapping2) );
    Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
//    Vec_IntForEachEntry( vLeaves, iLit, i )
//        assert( Abc_Lit2Var(iLit) < Abc_Lit2Var(iObjLit1) );
    Vec_IntForEachEntry( vLeaves, iLit, i )
        Vec_IntPush( vMapping2, Abc_Lit2Var(iLit)  );
    Vec_IntPush( vMapping2, Abc_Lit2Var(iObjLit1) );
    return iObjLit1;
}